

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_usadd_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b)

{
  TCGv_i64 v1;
  uintptr_t o;
  uintptr_t o_3;
  uintptr_t o_2;
  uintptr_t o_1;
  
  v1 = tcg_const_i64_tricore(tcg_ctx,-1);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_add_i64,(TCGArg)(d + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(a + (long)&tcg_ctx->pool_cur),(TCGArg)(b + (long)tcg_ctx));
  tcg_gen_movcond_i64_tricore(tcg_ctx,TCG_COND_LTU,d,d,a,v1,d);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(v1 + (long)tcg_ctx));
  return;
}

Assistant:

static void tcg_gen_usadd_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b)
{
    TCGv_i64 max = tcg_const_i64(tcg_ctx, -1);
    tcg_gen_add_i64(tcg_ctx, d, a, b);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, d, d, a, max, d);
    tcg_temp_free_i64(tcg_ctx, max);
}